

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O0

void av1_idct4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int32_t *piVar2;
  long in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [4];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int32_t local_58 [5];
  int8_t bit;
  int32_t value;
  int32_t *piVar3;
  
  piVar2 = cospi_arr((int)in_DL);
  *in_RSI = *in_RDI;
  in_RSI[1] = in_RDI[2];
  in_RSI[2] = in_RDI[1];
  in_RSI[3] = in_RDI[3];
  av1_range_check_buf(1,in_RDI,in_RSI,4,*(int8_t *)(in_RCX + 1));
  unique0x1000022b = local_58;
  piVar3 = in_RSI;
  iVar1 = half_btf(piVar2[0x20],*in_RSI,piVar2[0x20],in_RSI[1],(int)in_DL);
  *stack0xffffffffffffffb8 = iVar1;
  iVar1 = half_btf(piVar2[0x20],*piVar3,-piVar2[0x20],piVar3[1],(int)in_DL);
  stack0xffffffffffffffb8[1] = iVar1;
  iVar1 = half_btf(piVar2[0x30],piVar3[2],-piVar2[0x10],piVar3[3],(int)in_DL);
  stack0xffffffffffffffb8[2] = iVar1;
  iVar1 = half_btf(piVar2[0x10],piVar3[2],piVar2[0x30],piVar3[3],(int)in_DL);
  stack0xffffffffffffffb8[3] = iVar1;
  av1_range_check_buf(2,in_RDI,stack0xffffffffffffffb8,4,*(int8_t *)(in_RCX + 2));
  value = (int32_t)local_58;
  bit = (int8_t)((ulong)in_RSI >> 0x38);
  piVar3 = in_RSI;
  iVar1 = clamp_value(value,bit);
  stack0xffffffffffffffb8 = piVar3;
  piVar3 = stack0xffffffffffffffb8;
  *stack0xffffffffffffffb8 = iVar1;
  bit = (int8_t)((ulong)stack0xffffffffffffffb8 >> 0x38);
  iVar1 = clamp_value(value,bit);
  stack0xffffffffffffffb8 = piVar3;
  piVar3 = stack0xffffffffffffffb8;
  stack0xffffffffffffffb8[1] = iVar1;
  bit = (int8_t)((ulong)stack0xffffffffffffffb8 >> 0x38);
  iVar1 = clamp_value(value,bit);
  stack0xffffffffffffffb8 = piVar3;
  piVar3 = stack0xffffffffffffffb8;
  stack0xffffffffffffffb8[2] = iVar1;
  bit = (int8_t)((ulong)stack0xffffffffffffffb8 >> 0x38);
  iVar1 = clamp_value(value,bit);
  stack0xffffffffffffffb8 = piVar3;
  stack0xffffffffffffffb8[3] = iVar1;
  return;
}

Assistant:

void av1_idct4(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 4;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[4];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[2];
  bf1[2] = input[1];
  bf1[3] = input[3];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
}